

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsSecondDeriv
          (BeagleCPUImpl<float,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int secondDerivativeIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood,
          double *outSumFirstDerivative,double *outSumSecondDerivative)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  int iVar6;
  float *pfVar7;
  float **ppfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  int *piVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  float *pfVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  float *pfVar31;
  uint uVar32;
  int iVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  double dVar49;
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined8 in_XMM6_Qb;
  
  pfVar7 = this->gPartials[parIndex];
  ppfVar8 = this->gTransitionMatrices;
  pfVar9 = ppfVar8[probIndex];
  pfVar10 = ppfVar8[firstDerivativeIndex];
  pfVar11 = ppfVar8[secondDerivativeIndex];
  pfVar12 = this->gStateFrequencies[stateFrequenciesIndex];
  pfVar13 = this->gCategoryWeights[categoryWeightsIndex];
  memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
  memset(this->firstDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
  memset(this->secondDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
  if ((childIndex < this->kTipCount) &&
     (piVar14 = this->gTipStates[childIndex], piVar14 != (int *)0x0)) {
    iVar33 = this->kCategoryCount;
    uVar32 = this->kPatternCount;
    if (0 < (long)iVar33) {
      iVar4 = this->kMatrixSize;
      uVar5 = this->kStateCount;
      lVar24 = 0;
      lVar26 = 0;
      iVar6 = this->kPartialsPaddedStateCount;
      iVar21 = 0;
      do {
        if (0 < (int)uVar32) {
          lVar26 = (long)(int)lVar26;
          uVar30 = 0;
          fVar40 = pfVar13[lVar24];
          pfVar25 = this->integrationTmp;
          pfVar15 = this->firstDerivTmp;
          pfVar31 = pfVar7 + lVar26;
          pfVar16 = this->secondDerivTmp;
          iVar29 = this->kTransPaddedStateCount;
          iVar23 = 0;
          do {
            if (0 < (int)uVar5) {
              lVar22 = (long)piVar14[uVar30] + (long)iVar21;
              uVar28 = 0;
              do {
                auVar35 = vfmadd213ss_fma(ZEXT416((uint)(pfVar9[lVar22] * pfVar31[uVar28])),
                                          ZEXT416((uint)fVar40),
                                          ZEXT416((uint)pfVar25[(long)iVar23 + uVar28]));
                pfVar25[(long)iVar23 + uVar28] = auVar35._0_4_;
                auVar35 = vfmadd213ss_fma(ZEXT416((uint)(pfVar10[lVar22] * pfVar31[uVar28])),
                                          ZEXT416((uint)fVar40),
                                          ZEXT416((uint)pfVar15[(long)iVar23 + uVar28]));
                pfVar15[(long)iVar23 + uVar28] = auVar35._0_4_;
                pfVar17 = pfVar11 + lVar22;
                lVar22 = lVar22 + iVar29;
                auVar35 = vfmadd213ss_fma(ZEXT416((uint)(*pfVar17 * pfVar31[uVar28])),
                                          ZEXT416((uint)fVar40),
                                          ZEXT416((uint)pfVar16[(long)iVar23 + uVar28]));
                pfVar16[(long)iVar23 + uVar28] = auVar35._0_4_;
                uVar28 = uVar28 + 1;
              } while (uVar5 != uVar28);
              iVar23 = iVar23 + (int)uVar28;
            }
            lVar26 = lVar26 + iVar6;
            pfVar31 = pfVar31 + iVar6;
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar32);
        }
        iVar21 = iVar21 + iVar4;
        lVar24 = lVar24 + 1;
      } while (lVar24 != iVar33);
    }
  }
  else {
    iVar33 = this->kCategoryCount;
    uVar32 = this->kPatternCount;
    if (0 < (long)iVar33) {
      uVar5 = this->kStateCount;
      iVar21 = 0;
      lVar26 = 0;
      pfVar31 = this->gPartials[childIndex];
      iVar4 = this->kMatrixSize;
      iVar6 = this->kPartialsPaddedStateCount;
      lVar24 = 0;
      do {
        if (0 < (int)uVar32) {
          auVar35._0_8_ = (double)pfVar13[lVar24];
          auVar35._8_8_ = in_XMM6_Qb;
          lVar26 = (long)(int)lVar26;
          uVar27 = 0;
          pfVar15 = this->integrationTmp;
          pfVar16 = this->firstDerivTmp;
          pfVar17 = this->secondDerivTmp;
          pfVar25 = pfVar31 + lVar26;
          lVar22 = 0;
          do {
            if (0 < (int)uVar5) {
              lVar22 = (long)(int)lVar22;
              uVar30 = 0;
              iVar29 = iVar21;
              do {
                dVar41 = 0.0;
                dVar49 = 0.0;
                dVar34 = 0.0;
                uVar28 = 0;
                do {
                  fVar40 = pfVar25[uVar28];
                  dVar34 = dVar34 + (double)(fVar40 * pfVar9[(long)iVar29 + uVar28]);
                  lVar19 = (long)iVar29 + uVar28;
                  lVar20 = (long)iVar29 + uVar28;
                  uVar28 = uVar28 + 1;
                  dVar49 = dVar49 + (double)(fVar40 * pfVar10[lVar19]);
                  dVar41 = dVar41 + (double)(fVar40 * pfVar11[lVar20]);
                } while (uVar5 != uVar28);
                auVar54._0_8_ = (double)pfVar15[lVar22];
                auVar54._8_8_ = in_XMM6_Qb;
                iVar29 = iVar29 + uVar5 + 1;
                auVar51._8_8_ = 0;
                auVar51._0_8_ = dVar34 * (double)pfVar7[lVar26 + uVar30];
                auVar42 = vfmadd231sd_fma(auVar54,auVar35,auVar51);
                pfVar15[lVar22] = (float)auVar42._0_8_;
                auVar52._0_8_ = (double)pfVar16[lVar22];
                auVar52._8_8_ = in_XMM6_Qb;
                auVar43._8_8_ = 0;
                auVar43._0_8_ = dVar49 * (double)pfVar7[lVar26 + uVar30];
                auVar42 = vfmadd231sd_fma(auVar52,auVar35,auVar43);
                pfVar16[lVar22] = (float)auVar42._0_8_;
                lVar19 = lVar26 + uVar30;
                auVar53._0_8_ = (double)pfVar17[lVar22];
                auVar53._8_8_ = in_XMM6_Qb;
                uVar30 = uVar30 + 1;
                auVar42._8_8_ = 0;
                auVar42._0_8_ = dVar41 * (double)pfVar7[lVar19];
                auVar42 = vfmadd231sd_fma(auVar53,auVar35,auVar42);
                pfVar17[lVar22] = (float)auVar42._0_8_;
                lVar22 = lVar22 + 1;
              } while (uVar30 != uVar5);
            }
            lVar26 = lVar26 + iVar6;
            pfVar25 = pfVar25 + iVar6;
            uVar27 = uVar27 + 1;
          } while (uVar27 != uVar32);
        }
        lVar24 = lVar24 + 1;
        iVar21 = iVar21 + iVar4;
      } while (lVar24 != iVar33);
    }
  }
  if (0 < (int)uVar32) {
    lVar24 = 0;
    iVar33 = 0;
    do {
      iVar4 = this->kStateCount;
      if ((long)iVar4 < 1) {
        auVar35 = ZEXT816(0);
        fVar50 = 0.0;
        fVar40 = 0.0;
      }
      else {
        auVar43 = ZEXT816(0) << 0x40;
        auVar42 = ZEXT816(0) << 0x40;
        auVar35 = ZEXT816(0);
        lVar26 = 0;
        do {
          fVar40 = pfVar12[lVar26];
          auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)fVar40),
                                    ZEXT416((uint)this->integrationTmp[iVar33 + lVar26]));
          auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar40),
                                    ZEXT416((uint)this->firstDerivTmp[iVar33 + lVar26]));
          auVar43 = vfmadd231ss_fma(auVar43,ZEXT416((uint)fVar40),
                                    ZEXT416((uint)this->secondDerivTmp[iVar33 + lVar26]));
          lVar26 = lVar26 + 1;
        } while (iVar4 != lVar26);
        iVar33 = iVar33 + iVar4;
        fVar40 = auVar43._0_4_;
        fVar50 = auVar42._0_4_;
      }
      fVar48 = auVar35._0_4_;
      dVar34 = log((double)fVar48);
      auVar44._0_4_ = fVar40 / fVar48;
      auVar44._4_12_ = SUB6012((undefined1  [60])0x0,0);
      this->outLogLikelihoodsTmp[lVar24] = (float)dVar34;
      auVar36._0_4_ = fVar50 / fVar48;
      auVar36._4_12_ = SUB6012((undefined1  [60])0x0,0);
      this->outFirstDerivativesTmp[lVar24] = auVar36._0_4_;
      auVar35 = vfnmadd231ss_fma(auVar44,auVar36,auVar36);
      this->outSecondDerivativesTmp[lVar24] = auVar35._0_4_;
      lVar24 = lVar24 + 1;
      uVar32 = this->kPatternCount;
    } while (lVar24 < (int)uVar32);
  }
  if (scalingFactorsIndex != -1) {
    if ((int)uVar32 < 1) {
      *outSumLogLikelihood = 0.0;
      *outSumFirstDerivative = 0.0;
      *outSumSecondDerivative = 0.0;
      goto LAB_001398e1;
    }
    uVar30 = 0;
    pfVar7 = this->gScaleBuffers[scalingFactorsIndex];
    pfVar9 = this->outLogLikelihoodsTmp;
    do {
      pfVar9[uVar30] = pfVar7[uVar30] + pfVar9[uVar30];
      uVar30 = uVar30 + 1;
    } while (uVar32 != uVar30);
  }
  *outSumLogLikelihood = 0.0;
  *outSumFirstDerivative = 0.0;
  *outSumSecondDerivative = 0.0;
  if (0 < (int)uVar32) {
    uVar30 = 0;
    pdVar18 = this->gPatternWeights;
    pfVar7 = this->outLogLikelihoodsTmp;
    pfVar9 = this->outFirstDerivativesTmp;
    pfVar10 = this->outSecondDerivativesTmp;
    do {
      auVar37._0_8_ = (double)pfVar7[uVar30];
      auVar37._8_8_ = in_XMM6_Qb;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = pdVar18[uVar30];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *outSumLogLikelihood;
      auVar35 = vfmadd213sd_fma(auVar45,auVar37,auVar1);
      *outSumLogLikelihood = auVar35._0_8_;
      auVar38._0_8_ = (double)pfVar9[uVar30];
      auVar38._8_8_ = in_XMM6_Qb;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = pdVar18[uVar30];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *outSumFirstDerivative;
      auVar35 = vfmadd213sd_fma(auVar46,auVar38,auVar2);
      *outSumFirstDerivative = auVar35._0_8_;
      auVar39._0_8_ = (double)pfVar10[uVar30];
      auVar39._8_8_ = in_XMM6_Qb;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = pdVar18[uVar30];
      uVar30 = uVar30 + 1;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *outSumSecondDerivative;
      auVar35 = vfmadd213sd_fma(auVar47,auVar39,auVar3);
      *outSumSecondDerivative = auVar35._0_8_;
    } while (uVar32 != uVar30);
  }
LAB_001398e1:
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDeriv(const int parIndex,
                                                                         const int childIndex,
                                                                         const int probIndex,
                                                                         const int firstDerivativeIndex,
                                                                         const int secondDerivativeIndex,
                                                                         const int categoryWeightsIndex,
                                                                         const int stateFrequenciesIndex,
                                                                         const int scalingFactorsIndex,
                                                                         double* outSumLogLikelihood,
                                                                         double* outSumFirstDerivative,
                                                                         double* outSumSecondDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(secondDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    double sumOverJD2 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        REALTYPE sumOverID2 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            sumOverID2 += freqs[i] * secondDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
        outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    *outSumSecondDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];

        *outSumSecondDerivative += outSecondDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}